

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

void Js::JavascriptObject::CopyDataPropertiesForProxyObjects<false>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  JavascriptArray *pJVar2;
  RecyclableObject *obj;
  bool bVar3;
  BOOLEAN BVar4;
  int iVar5;
  PropertyId propertyId_00;
  BOOL BVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  PCWSTR pWVar8;
  undefined1 local_90 [7];
  bool found;
  PropertyDescriptor propertyDescriptor;
  Var pvStack_58;
  uint32 j;
  Var propValue;
  PropertyRecord *pPStack_48;
  PropertyId propertyId;
  PropertyRecord *propertyRecord;
  Var nextKey;
  JavascriptArray *pJStack_30;
  uint32 length;
  JavascriptArray *keys;
  ScriptContext *scriptContext_local;
  BVSparse<Memory::Recycler> *excluded_local;
  RecyclableObject *to_local;
  RecyclableObject *from_local;
  
  keys = (JavascriptArray *)scriptContext;
  scriptContext_local = (ScriptContext *)excluded;
  excluded_local = (BVSparse<Memory::Recycler> *)to;
  to_local = from;
  pJStack_30 = Js::JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from,scriptContext);
  nextKey._4_4_ = ArrayObject::GetLength(&pJStack_30->super_ArrayObject);
  pPStack_48 = (PropertyRecord *)0x0;
  pvStack_58 = (Var)0x0;
  propertyDescriptor._44_4_ = 0;
  do {
    if (nextKey._4_4_ <= (uint)propertyDescriptor._44_4_) {
      return;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
    iVar5 = (*(pJStack_30->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJStack_30,(ulong)(uint)propertyDescriptor._44_4_);
    propertyRecord = (PropertyRecord *)CONCAT44(extraout_var,iVar5);
    bVar3 = VarIs<Js::JavascriptSymbol>(propertyRecord);
    if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptString>(propertyRecord), !bVar3)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x6ed,
                                  "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                  ,
                                  "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    JavascriptConversion::ToPropertyKey
              (propertyRecord,(ScriptContext *)keys,&stack0xffffffffffffffb8,(PropertyString **)0x0)
    ;
    propValue._4_4_ = PropertyRecord::GetPropertyId(pPStack_48);
    if (propValue._4_4_ == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x6f1,"(propertyId != Constants::NoProperty)",
                                  "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty."
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = false;
    if (scriptContext_local != (ScriptContext *)0x0) {
      BVar4 = BVSparse<Memory::Recycler>::Test
                        ((BVSparse<Memory::Recycler> *)scriptContext_local,propValue._4_4_);
      bVar3 = BVar4 != '\0';
    }
    obj = to_local;
    if (!bVar3) {
      propertyId_00 = PropertyRecord::GetPropertyId(pPStack_48);
      BVar6 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                        (obj,propertyId_00,(ScriptContext *)keys,(PropertyDescriptor *)local_90);
      if ((BVar6 != 0) &&
         (bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_90), bVar3)) {
        BVar6 = Js::JavascriptOperators::GetOwnProperty
                          (to_local,propValue._4_4_,&stack0xffffffffffffffa8,(ScriptContext *)keys,
                           (PropertyValueInfo *)0x0);
        pJVar2 = keys;
        if (BVar6 == 0) {
          pWVar8 = GetCopyDataPropertiesEntryName<false>();
          JavascriptError::ThrowTypeError((ScriptContext *)pJVar2,-0x7ff5ec36,pWVar8);
        }
        BVar6 = CreateDataProperty((RecyclableObject *)excluded_local,propValue._4_4_,pvStack_58,
                                   (ScriptContext *)keys);
        pJVar2 = keys;
        if (BVar6 == 0) {
          pWVar8 = GetCopyDataPropertiesEntryName<false>();
          JavascriptError::ThrowTypeError((ScriptContext *)pJVar2,-0x7ff5ec36,pWVar8);
        }
      }
    }
    propertyDescriptor._44_4_ = propertyDescriptor._44_4_ + 1;
  } while( true );
}

Assistant:

void JavascriptObject::CopyDataPropertiesForProxyObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper
    JavascriptArray *keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from, scriptContext);
    uint32 length = keys->GetLength();
    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var propValue = nullptr;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        // Spec doesn't strictly call for us to use ToPropertyKey but since we know nextKey is already a symbol or string primitive, ToPropertyKey will be a nop and return us the propertyRecord
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty.");

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(propertyId);
        }
        if (!found)
        {
            if (JavascriptOperators::GetOwnPropertyDescriptor(from, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    if (!JavascriptOperators::GetOwnProperty(from, propertyId, &propValue, scriptContext, nullptr))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                    if (assign)
                    {
                        if (!JavascriptOperators::SetProperty(to, to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                    else
                    {
                        if (!CreateDataProperty(to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                }
            }
        }
    }
}